

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

Id __thiscall spv::Builder::makeSampledImageType(Builder *this,Id imageType)

{
  pointer *pppIVar1;
  pointer ppIVar2;
  iterator __position;
  iterator __position_00;
  ulong uVar3;
  uint uVar4;
  Id IVar6;
  ulong uVar7;
  bool bVar8;
  Instruction *local_20;
  _Head_base<0UL,_spv::Instruction_*,_false> local_18;
  ulong uVar5;
  
  ppIVar2 = this->groupedTypes[0x1b].
            super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (uint)((ulong)((long)this->groupedTypes[0x1b].
                               super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar2) >> 3);
  bVar8 = 0 < (int)uVar4;
  if (0 < (int)uVar4) {
    local_20 = *ppIVar2;
    if (*(local_20->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start != imageType) {
      uVar4 = uVar4 & 0x7fffffff;
      uVar5 = (ulong)uVar4;
      uVar3 = 1;
      do {
        uVar7 = uVar3;
        if (uVar5 == uVar7) {
          bVar8 = uVar7 < uVar5;
          goto LAB_001b6d75;
        }
        local_20 = ppIVar2[uVar7];
        uVar3 = uVar7 + 1;
      } while (*(local_20->operands).
                super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start != imageType);
      bVar8 = uVar7 < uVar5;
    }
    uVar4 = local_20->resultId;
  }
LAB_001b6d75:
  if (!bVar8) {
    local_20 = (Instruction *)::dxil_spv::allocate_in_thread(0x38);
    IVar6 = this->uniqueId + 1;
    this->uniqueId = IVar6;
    local_20->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f81e0;
    local_20->resultId = IVar6;
    local_20->typeId = 0;
    local_20->opCode = OpTypeSampledImage;
    (local_20->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (local_20->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_20->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_20->block = (Block *)0x0;
    local_18._M_head_impl._0_4_ = imageType;
    __position._M_current =
         (local_20->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (local_20->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                 &local_20->operands,__position,(uint *)&local_18);
    }
    else {
      *__position._M_current = imageType;
      (local_20->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    __position_00._M_current =
         this->groupedTypes[0x1b].
         super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position_00._M_current ==
        this->groupedTypes[0x1b].
        super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<spv::Instruction*,dxil_spv::ThreadLocalAllocator<spv::Instruction*>>::
      _M_realloc_insert<spv::Instruction*const&>
                ((vector<spv::Instruction*,dxil_spv::ThreadLocalAllocator<spv::Instruction*>> *)
                 (this->groupedTypes + 0x1b),__position_00,&local_20);
    }
    else {
      *__position_00._M_current = local_20;
      pppIVar1 = &this->groupedTypes[0x1b].
                  super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppIVar1 = *pppIVar1 + 1;
    }
    local_18._M_head_impl = local_20;
    std::
    vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
    ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
              ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                *)&this->constantsTypesGlobals,
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_18);
    if (local_18._M_head_impl != (Instruction *)0x0) {
      (*(local_18._M_head_impl)->_vptr_Instruction[1])();
    }
    Module::mapInstruction(&this->module,local_20);
    uVar4 = local_20->resultId;
  }
  return uVar4;
}

Assistant:

Id Builder::makeSampledImageType(Id imageType)
{
    // try to find it
    Instruction* type;
    for (int t = 0; t < (int)groupedTypes[OpTypeSampledImage].size(); ++t) {
        type = groupedTypes[OpTypeSampledImage][t];
        if (type->getIdOperand(0) == imageType)
            return type->getResultId();
    }

    // not found, make it
    type = new Instruction(getUniqueId(), NoType, OpTypeSampledImage);
    type->addIdOperand(imageType);

    groupedTypes[OpTypeSampledImage].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    return type->getResultId();
}